

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O2

CDBIterator * __thiscall CDBWrapper::NewIterator(CDBWrapper *this)

{
  DB *pDVar1;
  int iVar2;
  CDBIterator *this_00;
  LevelDBContext *pLVar3;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  __uniq_ptr_impl<CDBIterator::IteratorImpl,_std::default_delete<CDBIterator::IteratorImpl>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (CDBIterator *)operator_new(0x10);
  pLVar3 = DBContext(this);
  pDVar1 = pLVar3->pdb;
  pLVar3 = DBContext(this);
  iVar2 = (*pDVar1->_vptr_DB[6])(pDVar1,&pLVar3->iteroptions);
  local_28._M_t.
  super__Tuple_impl<0UL,_CDBIterator::IteratorImpl_*,_std::default_delete<CDBIterator::IteratorImpl>_>
  .super__Head_base<0UL,_CDBIterator::IteratorImpl_*,_false>._M_head_impl =
       (tuple<CDBIterator::IteratorImpl_*,_std::default_delete<CDBIterator::IteratorImpl>_>)
       operator_new(8);
  *(ulong *)local_28._M_t.
            super__Tuple_impl<0UL,_CDBIterator::IteratorImpl_*,_std::default_delete<CDBIterator::IteratorImpl>_>
            .super__Head_base<0UL,_CDBIterator::IteratorImpl_*,_false>._M_head_impl =
       CONCAT44(extraout_var,iVar2);
  CDBIterator::CDBIterator
            (this_00,this,
             (unique_ptr<CDBIterator::IteratorImpl,_std::default_delete<CDBIterator::IteratorImpl>_>
             )&local_28);
  std::unique_ptr<CDBIterator::IteratorImpl,_std::default_delete<CDBIterator::IteratorImpl>_>::
  ~unique_ptr((unique_ptr<CDBIterator::IteratorImpl,_std::default_delete<CDBIterator::IteratorImpl>_>
               *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

CDBIterator* CDBWrapper::NewIterator()
{
    return new CDBIterator{*this, std::make_unique<CDBIterator::IteratorImpl>(DBContext().pdb->NewIterator(DBContext().iteroptions))};
}